

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::h_IMULH_R(Instruction *this,ostream *os)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  void *this_00;
  ostream *in_RSI;
  long in_RDI;
  int srcIndex;
  int dstIndex;
  
  bVar1 = *(byte *)(in_RDI + 1);
  bVar2 = *(byte *)(in_RDI + 2);
  poVar3 = std::operator<<(in_RSI,"r");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1 % 8);
  poVar3 = std::operator<<(poVar3,", r");
  this_00 = (void *)std::ostream::operator<<(poVar3,(uint)bVar2 % 8);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Instruction::h_IMULH_R(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", r" << srcIndex << std::endl;
	}